

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_coin.cpp
# Opt level: O3

void __thiscall
cfdcapi_coin_EstimateFeeByTapscript_Test::~cfdcapi_coin_EstimateFeeByTapscript_Test
          (cfdcapi_coin_EstimateFeeByTapscript_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(cfdcapi_coin, EstimateFeeByTapscript) {
  ScriptBuilder builder;
  builder.AppendData("f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee901");
  builder.AppendData("201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac");
  builder.AppendData("c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54");
  Script template_script = builder.Build();
  EXPECT_EQ("41f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee90122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac4c61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54", template_script.GetHex());

  AddressFactory factory(NetType::kRegtest);
  std::vector<UtxoData> utxos = {
    UtxoData{
      12,
      BlockHash("590ba2283fbe5fb9363c74417bc1cb3f76d4df9d31890f9124b9e1706136b4f4"),
      Txid("195d6c18afaa6c33dcc2da86c6c0cd3f93ec2b44e4c8e9be00c7000eafa1805b"),
      0,
      Script("51203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d2"),
      Script(""),
      factory.GetAddress("bcrt1p8hh955u8526hjqhn5m5a5pmhymgecmxgerrmqj70tgvhk25mq8fq50z666"),
      "raw(51203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d2)",
      Amount::CreateBySatoshiAmount(2499999000),
      AddressType::kTaprootAddress,
#ifndef CFD_DISABLE_ELEMENTS
      nullptr,
      ConfidentialAssetId(),
      ElementsConfidentialAddress(),
      BlindFactor(),
      BlindFactor(),
      ConfidentialValue(),
#else
      nullptr,
#endif  // CFD_DISABLE_ELEMENTS
      template_script
    }
  };

  // 1 output data
  static const char* const kTxData = "02000000015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d500000000";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* fee_handle = nullptr;
  ret = CfdInitializeEstimateFee(handle, &fee_handle, false);
  EXPECT_EQ(kCfdSuccess, ret);

  if (ret == kCfdSuccess) {
    for (auto& utxo : utxos) {
      ret = CfdAddTxInputForEstimateFee(
          handle, fee_handle, utxo.txid.GetHex().c_str(), utxo.vout,
          utxo.descriptor.c_str(), nullptr,
          false, false, false, nullptr, 0, 0,
          utxo.scriptsig_template.GetHex().c_str());
      EXPECT_EQ(kCfdSuccess, ret);
    }

    int64_t tx_fee, utxo_fee;
    ret = CfdFinalizeEstimateFee(
        handle, fee_handle, kTxData, nullptr, &tx_fee, &utxo_fee, true, 2.0);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(static_cast<int64_t>(86), tx_fee);
    EXPECT_EQ(static_cast<int64_t>(184), utxo_fee);

    ret = CfdFreeEstimateFeeHandle(handle, fee_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  // exp: 020000000001015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee90122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5400000000
  // vsize: 133

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}